

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O0

void __thiscall
FastPForLib::
CompositeCodec<FastPForLib::SimplePFor<FastPForLib::Simple8b<true>_>,_FastPForLib::VariableByte>::
~CompositeCodec(CompositeCodec<FastPForLib::SimplePFor<FastPForLib::Simple8b<true>_>,_FastPForLib::VariableByte>
                *this)

{
  SimplePFor<FastPForLib::Simple8b<true>_> *in_RDI;
  
  (in_RDI->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_00468bf8;
  VariableByte::~VariableByte((VariableByte *)0x1339ea);
  SimplePFor<FastPForLib::Simple8b<true>_>::~SimplePFor(in_RDI);
  IntegerCODEC::~IntegerCODEC(&in_RDI->super_IntegerCODEC);
  return;
}

Assistant:

CompositeCodec() : codec1(), codec2() {}